

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O0

CurrencyPluralInfo * __thiscall
icu_63::CurrencyPluralInfo::operator=(CurrencyPluralInfo *this,CurrencyPluralInfo *info)

{
  UBool UVar1;
  int iVar2;
  Hashtable *pHVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__child_stack;
  void *in_R8;
  CurrencyPluralInfo *info_local;
  CurrencyPluralInfo *this_local;
  PluralRules *status;
  
  if (this != info) {
    this->fInternalStatus = info->fInternalStatus;
    UVar1 = ::U_FAILURE(this->fInternalStatus);
    if (UVar1 == '\0') {
      deleteHash(this,this->fPluralCountToCurrencyUnitPattern);
      pHVar3 = initHash(this,&this->fInternalStatus);
      this->fPluralCountToCurrencyUnitPattern = pHVar3;
      pHVar3 = info->fPluralCountToCurrencyUnitPattern;
      status = (PluralRules *)&this->fInternalStatus;
      copyHash(this,pHVar3,this->fPluralCountToCurrencyUnitPattern,(UErrorCode *)status);
      UVar1 = ::U_FAILURE(this->fInternalStatus);
      if (UVar1 == '\0') {
        __child_stack = extraout_RDX;
        if (this->fPluralRules != (PluralRules *)0x0) {
          (*(this->fPluralRules->super_UObject)._vptr_UObject[1])();
          __child_stack = extraout_RDX_00;
        }
        this->fPluralRules = (PluralRules *)0x0;
        if (this->fLocale != (Locale *)0x0) {
          (*(this->fLocale->super_UObject)._vptr_UObject[1])();
          __child_stack = extraout_RDX_01;
        }
        this->fLocale = (Locale *)0x0;
        if (info->fPluralRules != (PluralRules *)0x0) {
          iVar2 = PluralRules::clone(info->fPluralRules,(__fn *)pHVar3,__child_stack,(int)status,
                                     in_R8);
          status = (PluralRules *)CONCAT44(extraout_var,iVar2);
          this->fPluralRules = status;
          __child_stack = extraout_RDX_02;
          if (this->fPluralRules == (PluralRules *)0x0) {
            this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            return this;
          }
        }
        if (info->fLocale != (Locale *)0x0) {
          iVar2 = Locale::clone(info->fLocale,(__fn *)pHVar3,__child_stack,(int)status,in_R8);
          this->fLocale = (Locale *)CONCAT44(extraout_var_00,iVar2);
          if (this->fLocale == (Locale *)0x0) {
            this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
          }
          else {
            UVar1 = Locale::isBogus(info->fLocale);
            if ((UVar1 == '\0') && (UVar1 = Locale::isBogus(this->fLocale), UVar1 != '\0')) {
              this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

CurrencyPluralInfo&
CurrencyPluralInfo::operator=(const CurrencyPluralInfo& info) {
    if (this == &info) {
        return *this;
    }

    fInternalStatus = info.fInternalStatus;
    if (U_FAILURE(fInternalStatus)) {
        // bail out early if the object we were copying from was already 'invalid'.
        return *this;
    }

    deleteHash(fPluralCountToCurrencyUnitPattern);
    fPluralCountToCurrencyUnitPattern = initHash(fInternalStatus);
    copyHash(info.fPluralCountToCurrencyUnitPattern, 
             fPluralCountToCurrencyUnitPattern, fInternalStatus);
    if ( U_FAILURE(fInternalStatus) ) {
        return *this;
    }

    delete fPluralRules;
    fPluralRules = nullptr;
    delete fLocale;
    fLocale = nullptr;

    if (info.fPluralRules != nullptr) {
        fPluralRules = info.fPluralRules->clone();
        if (fPluralRules == nullptr) {
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
    }
    if (info.fLocale != nullptr) {
        fLocale = info.fLocale->clone();
        if (fLocale == nullptr) {
            // Note: If clone had an error parameter, then we could check/set that instead.
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
        // If the other locale wasn't bogus, but our clone'd locale is bogus, then OOM happened
        // during the call to clone().
        if (!info.fLocale->isBogus() && fLocale->isBogus()) {
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
    }
    return *this;
}